

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::writePlotFile(PeleLM *this,string *dir,ostream *os,How how)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  element_type *peVar3;
  Amr *pAVar4;
  Real RVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar6;
  int iVar7;
  int iVar8;
  IndexType IVar9;
  int ncomp;
  int iVar10;
  TimeCenter TVar11;
  StateDescriptor *pSVar12;
  string *psVar13;
  long lVar14;
  _List_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  ostream *poVar17;
  DeriveRec *pDVar18;
  tm *__tp;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  _Base_ptr p_Var24;
  unsigned_long i;
  ulong uVar25;
  _List_node_base *p_Var26;
  ulong uVar27;
  int k;
  long lVar28;
  int i_1;
  int iVar29;
  int i_5;
  long lVar30;
  int n;
  int iVar31;
  long lVar32;
  Real local_1348;
  string FullPath;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> plot_var_map;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  derive_names;
  string LevelStr;
  time_t now;
  string TheFullPath;
  ParmParse pp;
  MultiFab plotMF;
  
  bVar6 = amrex::Amr::Plot_Files_Output();
  if (bVar6) {
    std::__cxx11::string::string((string *)&plotMF,"ht",(allocator *)&TheFullPath);
    amrex::ParmParse::ParmParse(&pp,(string *)&plotMF);
    std::__cxx11::string::~string((string *)&plotMF);
    amrex::ParmParse::query(&pp,"plot_rhoydot",&plot_rhoydot,0);
    plot_var_map.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    plot_var_map.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    plot_var_map.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (lVar32 = 0;
        iVar7 = amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst),
        lVar32 < iVar7; lVar32 = lVar32 + 1) {
      iVar7 = 0;
      while( true ) {
        iVar31 = (int)lVar32;
        pSVar12 = amrex::DescriptorList::operator[]
                            ((DescriptorList *)amrex::AmrLevel::desc_lst,iVar31);
        iVar8 = amrex::StateDescriptor::nComp(pSVar12);
        if (iVar8 <= iVar7) break;
        pSVar12 = amrex::DescriptorList::operator[]
                            ((DescriptorList *)amrex::AmrLevel::desc_lst,iVar31);
        psVar13 = amrex::StateDescriptor::name_abi_cxx11_(pSVar12,iVar7);
        bVar6 = amrex::Amr::isStatePlotVar(psVar13);
        if (bVar6) {
          pSVar12 = amrex::DescriptorList::operator[]
                              ((DescriptorList *)amrex::AmrLevel::desc_lst,iVar31);
          IVar9 = amrex::StateDescriptor::getType(pSVar12);
          if (IVar9.itype == 0) {
            lVar14 = std::__cxx11::string::find((char *)psVar13,0x603954);
            if (lVar14 == -1) {
              plotMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                   iVar31;
              plotMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
                   iVar7;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         &plot_var_map,(pair<int,_int> *)&plotMF);
            }
            else if (plot_rhoydot == true) {
              plotMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                   iVar31;
              plotMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
                   iVar7;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         &plot_var_map,(pair<int,_int> *)&plotMF);
            }
          }
        }
        iVar7 = iVar7 + 1;
      }
    }
    derive_names.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&derive_names;
    derive_names.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    derive_names.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         derive_names.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    p_Var15 = (_List_node_base *)
              amrex::DeriveList::dlist_abi_cxx11_((DeriveList *)amrex::AmrLevel::derive_lst);
    iVar7 = 0;
    p_Var26 = p_Var15;
    while (p_Var26 = (((_List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                      &p_Var26->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var26 != p_Var15) {
      pDVar18 = (DeriveRec *)(p_Var26 + 1);
      psVar13 = amrex::DeriveRec::name_abi_cxx11_(pDVar18);
      bVar6 = amrex::Amr::isDerivePlotVar(psVar13);
      if (bVar6) {
        psVar13 = amrex::DeriveRec::name_abi_cxx11_(pDVar18);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&derive_names,psVar13);
        iVar8 = amrex::DeriveRec::numDerive(pDVar18);
        iVar7 = iVar7 + iVar8;
      }
    }
    p_Var1 = &(this->auxDiag)._M_t._M_impl.super__Rb_tree_header;
    iVar8 = 0;
    for (p_Var16 = (this->auxDiag)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var16 != p_Var1;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      iVar8 = iVar8 + *(int *)(*(long *)(p_Var16 + 2) + 0xcc);
    }
    iVar31 = (int)((ulong)((long)plot_var_map.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)plot_var_map.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    ncomp = iVar31 + iVar8 + iVar7 + 1;
    RVar5 = amrex::StateData::curTime
                      ((this->super_NavierStokesBase).super_AmrLevel.state.
                       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    if (((this->super_NavierStokesBase).super_AmrLevel.level == 0) &&
       (*(int *)(amrex::ParallelContext::frames + 0xc) == 0)) {
      (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[3])(&plotMF);
      poVar17 = std::operator<<(os,(string *)&plotMF);
      std::operator<<(poVar17,'\n');
      std::__cxx11::string::~string((string *)&plotMF);
      if (ncomp == 0) {
        amrex::Error_host("Must specify at least one valid data item to plot");
      }
      poVar17 = (ostream *)std::ostream::operator<<(os,ncomp);
      std::operator<<(poVar17,'\n');
      for (uVar25 = 0;
          uVar25 < (ulong)((long)plot_var_map.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)plot_var_map.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar25 = uVar25 + 1) {
        iVar29 = plot_var_map.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar25].second;
        pSVar12 = amrex::DescriptorList::operator[]
                            ((DescriptorList *)amrex::AmrLevel::desc_lst,
                             plot_var_map.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar25].first);
        psVar13 = amrex::StateDescriptor::name_abi_cxx11_(pSVar12,iVar29);
        poVar17 = std::operator<<(os,(string *)psVar13);
        std::operator<<(poVar17,'\n');
      }
      p_Var26 = (_List_node_base *)&derive_names;
      while (p_Var26 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var26->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var16 = auxDiag_names_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
            p_Var26 != (_List_node_base *)&derive_names) {
        pDVar18 = amrex::DeriveList::get
                            ((DeriveList *)amrex::AmrLevel::derive_lst,(string *)(p_Var26 + 1));
        for (iVar29 = 0; iVar10 = amrex::DeriveRec::numDerive(pDVar18), iVar29 < iVar10;
            iVar29 = iVar29 + 1) {
          psVar13 = amrex::DeriveRec::variableName_abi_cxx11_(pDVar18,iVar29);
          poVar17 = std::operator<<(os,(string *)psVar13);
          std::operator<<(poVar17,'\n');
        }
      }
      for (; (_Rb_tree_header *)p_Var16 !=
             &auxDiag_names_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        lVar14 = 0;
        for (lVar32 = 0; lVar32 < (long)p_Var16[2]._M_parent - *(long *)(p_Var16 + 2) >> 5;
            lVar32 = lVar32 + 1) {
          poVar17 = std::operator<<(os,(string *)(*(long *)(p_Var16 + 2) + lVar14));
          std::operator<<(poVar17,'\n');
          lVar14 = lVar14 + 0x20;
        }
      }
      std::operator<<(os,"volFrac\n");
      poVar17 = (ostream *)std::ostream::operator<<(os,3);
      std::operator<<(poVar17,'\n');
      poVar17 = std::ostream::_M_insert<double>
                          (((this->super_NavierStokesBase).super_AmrLevel.parent)->cumtime);
      std::operator<<(poVar17,'\n');
      uVar2 = *(uint *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                        super_AmrMesh.super_AmrInfo.field_0x8c;
      poVar17 = (ostream *)std::ostream::operator<<(os,uVar2);
      std::operator<<(poVar17,'\n');
      lVar14 = (long)(int)uVar2;
      for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
        poVar17 = std::ostream::_M_insert<double>
                            ((this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo
                             [lVar32]);
        std::operator<<(poVar17,' ');
      }
      std::operator<<(os,'\n');
      for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
        poVar17 = std::ostream::_M_insert<double>
                            ((this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi
                             [lVar32]);
        std::operator<<(poVar17,' ');
      }
      std::operator<<(os,'\n');
      uVar27 = 0;
      uVar25 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar25 = uVar27;
      }
      for (; uVar25 * 0xc - uVar27 != 0; uVar27 = uVar27 + 0xc) {
        poVar17 = (ostream *)
                  std::ostream::operator<<
                            (os,*(int *)((long)((((this->super_NavierStokesBase).super_AmrLevel.
                                                 parent)->super_AmrCore).super_AmrMesh.super_AmrInfo
                                                .ref_ratio.
                                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                .
                                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->vect +
                                        uVar27));
        std::operator<<(poVar17,' ');
      }
      std::operator<<(os,'\n');
      lVar32 = 0xac;
      for (lVar30 = 0; lVar30 <= lVar14; lVar30 = lVar30 + 1) {
        poVar17 = amrex::operator<<(os,(Box *)((long)(((((this->super_NavierStokesBase).
                                                         super_AmrLevel.parent)->super_AmrCore).
                                                       super_AmrMesh.geom.
                                                                                                              
                                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  .
                                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_CoordSys).offset + lVar32 + -8));
        std::operator<<(poVar17,' ');
        lVar32 = lVar32 + 200;
      }
      std::operator<<(os,'\n');
      for (lVar32 = 0; lVar32 <= lVar14; lVar32 = lVar32 + 1) {
        poVar17 = (ostream *)
                  std::ostream::operator<<
                            (os,(((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps
                                ).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar32]);
        std::operator<<(poVar17,' ');
      }
      std::operator<<(os,'\n');
      lVar32 = 0x20;
      for (lVar30 = 0; lVar30 <= lVar14; lVar30 = lVar30 + 1) {
        for (lVar28 = 0; lVar28 != 3; lVar28 = lVar28 + 1) {
          poVar17 = std::ostream::_M_insert<double>
                              (*(double *)
                                ((long)(((((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                         super_AmrCore).super_AmrMesh.geom.
                                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                         .
                                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys)
                                       .offset + lVar28 * 8 + lVar32 + -8));
          std::operator<<(poVar17,' ');
        }
        std::operator<<(os,'\n');
        lVar32 = lVar32 + 200;
      }
      poVar17 = (ostream *)
                std::ostream::operator<<
                          (os,(this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.
                              c_sys);
      std::operator<<(poVar17,'\n');
      std::operator<<(os,"0\n");
      std::ofstream::ofstream(&TheFullPath);
      std::__cxx11::string::string((string *)&LevelStr,(string *)dir);
      iVar29 = 1;
      std::__cxx11::string::string
                ((string *)&FullPath,
                 "===============================================================================\n"
                 ,(allocator *)&plotMF);
      std::__cxx11::string::append((char *)&LevelStr);
      std::ofstream::open((char *)&TheFullPath,(_Ios_Openmode)LevelStr._M_dataplus._M_p);
      std::operator<<((ostream *)&TheFullPath,(string *)&FullPath);
      std::operator<<((ostream *)&TheFullPath," Job Information\n");
      std::operator<<((ostream *)&TheFullPath,(string *)&FullPath);
      poVar17 = std::operator<<((ostream *)&TheFullPath,"number of MPI processes: ");
      poVar17 = (ostream *)
                std::ostream::operator<<(poVar17,*(int *)(amrex::ParallelContext::frames + 0x10));
      std::operator<<(poVar17,"\n");
      std::operator<<((ostream *)&TheFullPath,"\n\n");
      std::operator<<((ostream *)&TheFullPath,(string *)&FullPath);
      std::operator<<((ostream *)&TheFullPath," Plotfile Information\n");
      std::operator<<((ostream *)&TheFullPath,(string *)&FullPath);
      now = ::time((time_t *)0x0);
      __tp = localtime(&now);
      poVar17 = std::operator<<((ostream *)&TheFullPath,"output data / time: ");
      pcVar19 = asctime(__tp);
      std::operator<<(poVar17,pcVar19);
      pcVar19 = getcwd((char *)&plotMF,0x1000);
      if (pcVar19 != (char *)0x0) {
        poVar17 = std::operator<<((ostream *)&TheFullPath,"output dir:         ");
        poVar17 = std::operator<<(poVar17,(char *)&plotMF);
        std::operator<<(poVar17,"\n");
      }
      std::operator<<((ostream *)&TheFullPath,"\n\n");
      std::operator<<((ostream *)&TheFullPath,(string *)&FullPath);
      std::operator<<((ostream *)&TheFullPath," Build Information\n");
      std::operator<<((ostream *)&TheFullPath,(string *)&FullPath);
      poVar17 = std::operator<<((ostream *)&TheFullPath,"build date:    ");
      pcVar19 = amrex::buildInfoGetBuildDate();
      poVar17 = std::operator<<(poVar17,pcVar19);
      std::operator<<(poVar17,"\n");
      poVar17 = std::operator<<((ostream *)&TheFullPath,"build machine: ");
      pcVar19 = amrex::buildInfoGetBuildMachine();
      poVar17 = std::operator<<(poVar17,pcVar19);
      std::operator<<(poVar17,"\n");
      poVar17 = std::operator<<((ostream *)&TheFullPath,"build dir:     ");
      pcVar19 = amrex::buildInfoGetBuildDir();
      poVar17 = std::operator<<(poVar17,pcVar19);
      std::operator<<(poVar17,"\n");
      poVar17 = std::operator<<((ostream *)&TheFullPath,"BoxLib dir:    ");
      pcVar19 = amrex::buildInfoGetAMReXDir();
      poVar17 = std::operator<<(poVar17,pcVar19);
      std::operator<<(poVar17,"\n");
      std::operator<<((ostream *)&TheFullPath,"\n");
      poVar17 = std::operator<<((ostream *)&TheFullPath,"COMP:          ");
      pcVar19 = amrex::buildInfoGetComp();
      poVar17 = std::operator<<(poVar17,pcVar19);
      std::operator<<(poVar17,"\n");
      poVar17 = std::operator<<((ostream *)&TheFullPath,"COMP version:  ");
      pcVar19 = amrex::buildInfoGetCompVersion();
      poVar17 = std::operator<<(poVar17,pcVar19);
      std::operator<<(poVar17,"\n");
      poVar17 = std::operator<<((ostream *)&TheFullPath,"FCOMP:         ");
      pcVar19 = amrex::buildInfoGetFcomp();
      poVar17 = std::operator<<(poVar17,pcVar19);
      std::operator<<(poVar17,"\n");
      poVar17 = std::operator<<((ostream *)&TheFullPath,"FCOMP version: ");
      pcVar19 = amrex::buildInfoGetFcompVersion();
      poVar17 = std::operator<<(poVar17,pcVar19);
      std::operator<<(poVar17,"\n");
      std::operator<<((ostream *)&TheFullPath,"\n");
      for (; iVar10 = amrex::buildInfoGetNumModules(), iVar29 <= iVar10; iVar29 = iVar29 + 1) {
        pcVar19 = amrex::buildInfoGetModuleName(iVar29);
        poVar17 = std::operator<<((ostream *)&TheFullPath,pcVar19);
        poVar17 = std::operator<<(poVar17,": ");
        pcVar19 = amrex::buildInfoGetModuleVal(iVar29);
        poVar17 = std::operator<<(poVar17,pcVar19);
        std::operator<<(poVar17,"\n");
      }
      std::operator<<((ostream *)&TheFullPath,"\n");
      pcVar19 = amrex::buildInfoGetGitHash(1);
      pcVar20 = amrex::buildInfoGetGitHash(2);
      pcVar21 = amrex::buildInfoGetGitHash(3);
      pcVar22 = amrex::buildInfoGetGitHash(4);
      pcVar23 = amrex::buildInfoGetGitHash(5);
      if (*pcVar19 != '\0') {
        poVar17 = std::operator<<((ostream *)&TheFullPath,"PeleLM git hash: ");
        poVar17 = std::operator<<(poVar17,pcVar19);
        std::operator<<(poVar17,"\n");
      }
      if (*pcVar20 != '\0') {
        poVar17 = std::operator<<((ostream *)&TheFullPath,"AMReX git hash: ");
        poVar17 = std::operator<<(poVar17,pcVar20);
        std::operator<<(poVar17,"\n");
      }
      if (*pcVar21 != '\0') {
        poVar17 = std::operator<<((ostream *)&TheFullPath,"IAMR   git hash: ");
        poVar17 = std::operator<<(poVar17,pcVar21);
        std::operator<<(poVar17,"\n");
      }
      if (*pcVar22 != '\0') {
        poVar17 = std::operator<<((ostream *)&TheFullPath,"AMReX-Hydro git hash: ");
        poVar17 = std::operator<<(poVar17,pcVar22);
        std::operator<<(poVar17,"\n");
        if (*pcVar22 != '\0') {
          poVar17 = std::operator<<((ostream *)&TheFullPath,"PelePhysics git hash: ");
          poVar17 = std::operator<<(poVar17,pcVar23);
          std::operator<<(poVar17,"\n");
        }
      }
      std::operator<<((ostream *)&TheFullPath,"\n\n");
      std::operator<<((ostream *)&TheFullPath,(string *)&FullPath);
      std::operator<<((ostream *)&TheFullPath," Inputs File Parameters\n");
      std::operator<<((ostream *)&TheFullPath,(string *)&FullPath);
      amrex::ParmParse::dumpTable((ostream *)&TheFullPath,true);
      std::ofstream::close();
      std::__cxx11::string::~string((string *)&FullPath);
      std::__cxx11::string::~string((string *)&LevelStr);
      std::ofstream::~ofstream(&TheFullPath);
    }
    if ((writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
         BaseName_abi_cxx11_ == '\0') &&
       (iVar29 = __cxa_guard_acquire(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                                      ::BaseName_abi_cxx11_), iVar29 != 0)) {
      std::__cxx11::string::string
                ((string *)
                 &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                  BaseName_abi_cxx11_,"/Cell",(allocator *)&plotMF);
      __cxa_atexit(std::__cxx11::string::~string,
                   &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                    BaseName_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                           ::BaseName_abi_cxx11_);
    }
    std::__cxx11::string::string((string *)&plotMF,"Level_",(allocator *)&TheFullPath);
    amrex::Concatenate(&LevelStr,(string *)&plotMF,
                       (this->super_NavierStokesBase).super_AmrLevel.level,1);
    std::__cxx11::string::~string((string *)&plotMF);
    std::__cxx11::string::string((string *)&FullPath,(string *)dir);
    if ((FullPath._M_string_length != 0) &&
       (FullPath._M_dataplus._M_p[FullPath._M_string_length - 1] != '/')) {
      std::__cxx11::string::push_back((char)&FullPath);
    }
    std::__cxx11::string::append((string *)&FullPath);
    if ((*(int *)(amrex::ParallelContext::frames + 0xc) == 0) &&
       (bVar6 = amrex::UtilCreateDirectory(&FullPath,0x1ed,false), !bVar6)) {
      amrex::CreateDirectoryFailed(&FullPath);
    }
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) == 0) {
      poVar17 = (ostream *)
                std::ostream::operator<<(os,(this->super_NavierStokesBase).super_AmrLevel.level);
      poVar17 = std::operator<<(poVar17,' ');
      poVar17 = std::ostream::_M_insert<long>((long)poVar17);
      std::operator<<(poVar17,' ');
      poVar17 = std::ostream::_M_insert<double>(RVar5);
      std::operator<<(poVar17,'\n');
      poVar17 = (ostream *)
                std::ostream::operator<<
                          (os,(((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
                              super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [(this->super_NavierStokesBase).super_AmrLevel.level]);
      std::operator<<(poVar17,'\n');
      for (lVar32 = 0;
          peVar3 = (this->super_NavierStokesBase).super_AmrLevel.grids.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
          lVar32 < ((long)(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data) / 0x1c; lVar32 = lVar32 + 1) {
        amrex::BoxArray::operator[]
                  ((Box *)&TheFullPath,&(this->super_NavierStokesBase).super_AmrLevel.grids,
                   (int)lVar32);
        amrex::RealBox::RealBox
                  ((RealBox *)&plotMF,(Box *)&TheFullPath,
                   (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx,
                   (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo);
        for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
          poVar17 = std::ostream::_M_insert<double>
                              ((double)(&plotMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                         _vptr_FabArrayBase)[lVar14]);
          std::operator<<(poVar17,' ');
          poVar17 = std::ostream::_M_insert<double>
                              (*(double *)
                                ((long)&plotMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                        boxarray.m_bat.m_op + lVar14 * 8 + 0xc));
          std::operator<<(poVar17,'\n');
        }
      }
      if (-1 < iVar8 + iVar7 + iVar31) {
        std::__cxx11::string::string((string *)&plotMF,(string *)&LevelStr);
        std::__cxx11::string::append((string *)&plotMF);
        poVar17 = std::operator<<(os,(string *)&plotMF);
        std::operator<<(poVar17,'\n');
        std::__cxx11::string::~string((string *)&plotMF);
      }
      iVar7 = (this->super_NavierStokesBase).super_AmrLevel.level;
      if (iVar7 == *(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                            super_AmrMesh.super_AmrInfo.field_0x8c) {
        for (iVar8 = 0; iVar8 <= iVar7; iVar8 = iVar8 + 1) {
          std::operator<<(os,"1.0e-6\n");
          iVar7 = *(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                           super_AmrMesh.super_AmrInfo.field_0x8c;
        }
      }
    }
    TheFullPath._M_dataplus._M_p = (pointer)0x1;
    TheFullPath._M_string_length = 0;
    TheFullPath.field_2._M_allocated_capacity = 0;
    TheFullPath.field_2._8_8_ = 0;
    amrex::MultiFab::MultiFab
              (&plotMF,&(this->super_NavierStokesBase).super_AmrLevel.grids,
               &(this->super_NavierStokesBase).super_AmrLevel.dmap,ncomp,0,(MFInfo *)&TheFullPath,
               (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&TheFullPath.field_2);
    for (uVar25 = 0;
        uVar25 < (ulong)((long)plot_var_map.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)plot_var_map.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar25 = uVar25 + 1)
    {
      amrex::MultiFab::Copy
                (&plotMF,(MultiFab *)
                         (this->super_NavierStokesBase).super_AmrLevel.state.
                         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [plot_var_map.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar25].first].new_data._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                 ,plot_var_map.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar25].second,(int)uVar25,1,0);
    }
    if (derive_names.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size != 0) {
      p_Var26 = (_List_node_base *)&derive_names;
      while (p_Var26 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var26->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var26 != (_List_node_base *)&derive_names) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var26 + 1);
        bVar6 = std::operator==(__lhs,"avg_pressure");
        local_1348 = RVar5;
        if (((((bVar6) || (bVar6 = std::operator==(__lhs,"gradpx"), bVar6)) ||
             (bVar6 = std::operator==(__lhs,"gradpy"), bVar6)) ||
            (bVar6 = std::operator==(__lhs,"gradpz"), bVar6)) &&
           (TVar11 = amrex::StateDescriptor::timeType
                               ((this->super_NavierStokesBase).super_AmrLevel.state.
                                super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                                super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].desc),
           TVar11 != Interval)) {
          pAVar4 = (this->super_NavierStokesBase).super_AmrLevel.parent;
          local_1348 = amrex::StateData::curTime
                                 ((StateData *)
                                  (*(long *)((long)(pAVar4->amr_level).
                                                                                                      
                                                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                  .
                                                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [*(int *)&(pAVar4->super_AmrCore).super_AmrMesh.
                                                            super_AmrInfo.field_0x8c]._M_t.
                                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                            + 0x170) + 0xe0));
        }
        pDVar18 = amrex::DeriveList::get((DeriveList *)amrex::AmrLevel::derive_lst,__lhs);
        iVar7 = amrex::DeriveRec::numDerive(pDVar18);
        (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x1f])
                  (SUB84(local_1348,0),&TheFullPath,this,__lhs,0);
        amrex::MultiFab::Copy
                  (&plotMF,(MultiFab *)TheFullPath._M_dataplus._M_p,0,(int)uVar25,iVar7,0);
        if (TheFullPath._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)TheFullPath._M_dataplus._M_p + 8))();
        }
        uVar25 = (ulong)(uint)((int)uVar25 + iVar7);
      }
    }
    for (p_Var24 = (this->auxDiag)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar7 = (int)uVar25, (_Rb_tree_header *)p_Var24 != p_Var1;
        p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
      iVar8 = ((*(MultiFab **)(p_Var24 + 2))->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
              n_comp;
      amrex::MultiFab::Copy(&plotMF,*(MultiFab **)(p_Var24 + 2),0,iVar7,iVar8,0);
      uVar25 = (ulong)(uint)(iVar7 + iVar8);
    }
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&plotMF.super_FabArray<amrex::FArrayBox>,0.0,iVar7,1,0);
    amrex::MultiFab::Copy(&plotMF,(this->super_NavierStokesBase).volfrac,0,iVar7,1,0);
    amrex::EB_set_covered(&plotMF,0.0);
    std::__cxx11::string::string((string *)&TheFullPath,(string *)&FullPath);
    std::__cxx11::string::append((string *)&TheFullPath);
    amrex::VisMF::Write(&plotMF.super_FabArray<amrex::FArrayBox>,&TheFullPath,how,false);
    std::__cxx11::string::~string((string *)&TheFullPath);
    amrex::MultiFab::~MultiFab(&plotMF);
    std::__cxx11::string::~string((string *)&FullPath);
    std::__cxx11::string::~string((string *)&LevelStr);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&derive_names.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&plot_var_map.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&pp);
  }
  return;
}

Assistant:

void
PeleLM::writePlotFile (const std::string& dir,
                       std::ostream&  os,
                       VisMF::How     how)
{
  if ( ! Amr::Plot_Files_Output() ) return;

  ParmParse pp("ht");

  pp.query("plot_rhoydot",plot_rhoydot);
  //
  // Note that this is really the same as its NavierStokes counterpart,
  // but in order to add diagnostic MultiFabs into the plotfile, code had
  // to be interspersed within this function.
  //

  //
  // The list of indices of State to write to plotfile.
  // first component of pair is state_type,
  // second component of pair is component # within the state_type
  //
  std::vector<std::pair<int,int> > plot_var_map;
  for (long int typ = 0; typ < desc_lst.size(); typ++)
  {
    for (int comp = 0; comp < desc_lst[typ].nComp();comp++)
    {
      const std::string& name = desc_lst[typ].name(comp);

      if (parent->isStatePlotVar(name) && desc_lst[typ].getType() == IndexType::TheCellType())
      {
        //
        // When running SDC we get things of this form in the State.
        // I want a simple way not to write'm out to plotfiles.
        //
        if (name.find("I_R[") != std::string::npos)
        {
          if (plot_rhoydot)
            plot_var_map.push_back(std::pair<int,int>(typ,comp));
        }
        else
        {
          plot_var_map.push_back(std::pair<int,int>(typ,comp));
        }
      }
    }
  }

  int num_derive = 0;
  std::list<std::string> derive_names;
  const std::list<DeriveRec>& dlist = derive_lst.dlist();

  for (std::list<DeriveRec>::const_iterator it = dlist.begin(), end = dlist.end();
       it != end;
       ++it)
  {
    if (parent->isDerivePlotVar(it->name()))
    {
      derive_names.push_back(it->name());
      num_derive += it->numDerive();
    }
  }

  int num_auxDiag = 0;
  for (const auto& kv : auxDiag)
  {
    num_auxDiag += kv.second->nComp();
  }

  int n_data_items = plot_var_map.size() + num_derive + num_auxDiag;

#ifdef AMREX_USE_EB
    // add in vol frac
    n_data_items++;
#endif

  Real tnp1 = state[State_Type].curTime();

  if (level == 0 && ParallelDescriptor::IOProcessor())
  {
    //
    // The first thing we write out is the plotfile type.
    //
    os << thePlotFileType() << '\n';

    if (n_data_items == 0)
      amrex::Error("Must specify at least one valid data item to plot");

    os << n_data_items << '\n';

    //
    // Names of variables -- first state, then derived
    //
    for (long unsigned int i =0; i < plot_var_map.size(); i++)
    {
      int typ  = plot_var_map[i].first;
      int comp = plot_var_map[i].second;
      os << desc_lst[typ].name(comp) << '\n';
    }

    for (std::list<std::string>::const_iterator it = derive_names.begin(), end = derive_names.end();
         it != end;
         ++it)
    {
      const DeriveRec* rec = derive_lst.get(*it);
      for (int i = 0; i < rec->numDerive(); i++)
        os << rec->variableName(i) << '\n';
    }

    //
    // Hack in additional diagnostics.
    //
    for (std::map<std::string,Vector<std::string> >::const_iterator it = auxDiag_names.begin(), end = auxDiag_names.end();
         it != end;
         ++it)
    {
      for (long int i=0; i<it->second.size(); ++i)
        os << it->second[i] << '\n';
    }

#ifdef AMREX_USE_EB
    //add in vol frac
    os << "volFrac\n";
#endif

    os << AMREX_SPACEDIM << '\n';
    os << parent->cumTime() << '\n';
    int f_lev = parent->finestLevel();
    os << f_lev << '\n';
    for (int i = 0; i < AMREX_SPACEDIM; i++)
      os << Geom().ProbLo(i) << ' ';
    os << '\n';
    for (int i = 0; i < AMREX_SPACEDIM; i++)
      os << Geom().ProbHi(i) << ' ';
    os << '\n';
    for (int i = 0; i < f_lev; i++)
      os << parent->refRatio(i)[0] << ' ';
    os << '\n';
    for (int i = 0; i <= f_lev; i++)
      os << parent->Geom(i).Domain() << ' ';
    os << '\n';
    for (int i = 0; i <= f_lev; i++)
      os << parent->levelSteps(i) << ' ';
    os << '\n';
    for (int i = 0; i <= f_lev; i++)
    {
      for (int k = 0; k < AMREX_SPACEDIM; k++)
        os << parent->Geom(i).CellSize()[k] << ' ';
      os << '\n';
    }
    os << (int) Geom().Coord() << '\n';
    os << "0\n"; // Write bndry data.

    // job_info file with details about the run
    std::ofstream jobInfoFile;
    std::string FullPathJobInfoFile = dir;
    std::string PrettyLine = "===============================================================================\n";

    FullPathJobInfoFile += "/job_info";
    jobInfoFile.open(FullPathJobInfoFile.c_str(), std::ios::out);

    // job information
    jobInfoFile << PrettyLine;
    jobInfoFile << " Job Information\n";
    jobInfoFile << PrettyLine;

    jobInfoFile << "number of MPI processes: " << ParallelDescriptor::NProcs() << "\n";
#ifdef AMREX_USE_OMP
    jobInfoFile << "number of threads:       " << omp_get_max_threads() << "\n";
#endif
    jobInfoFile << "\n\n";

    // plotfile information
    jobInfoFile << PrettyLine;
    jobInfoFile << " Plotfile Information\n";
    jobInfoFile << PrettyLine;

    time_t now = time(0);

    // Convert now to tm struct for local timezone
    tm* localtm = localtime(&now);
    jobInfoFile   << "output data / time: " << asctime(localtm);

    char currentDir[FILENAME_MAX];
    if (getcwd(currentDir, FILENAME_MAX)) {
      jobInfoFile << "output dir:         " << currentDir << "\n";
    }

    jobInfoFile << "\n\n";


    // build information
    jobInfoFile << PrettyLine;
    jobInfoFile << " Build Information\n";
    jobInfoFile << PrettyLine;

    jobInfoFile << "build date:    " << buildInfoGetBuildDate() << "\n";
    jobInfoFile << "build machine: " << buildInfoGetBuildMachine() << "\n";
    jobInfoFile << "build dir:     " << buildInfoGetBuildDir() << "\n";
    jobInfoFile << "BoxLib dir:    " << buildInfoGetAMReXDir() << "\n";

    jobInfoFile << "\n";

    jobInfoFile << "COMP:          " << buildInfoGetComp() << "\n";
    jobInfoFile << "COMP version:  " << buildInfoGetCompVersion() << "\n";
    jobInfoFile << "FCOMP:         " << buildInfoGetFcomp() << "\n";
    jobInfoFile << "FCOMP version: " << buildInfoGetFcompVersion() << "\n";

    jobInfoFile << "\n";

    for (int nn = 1; nn <= buildInfoGetNumModules(); nn++) {
      jobInfoFile << buildInfoGetModuleName(nn) << ": " << buildInfoGetModuleVal(nn) << "\n";
    }

    jobInfoFile << "\n";

    const char* githash1 = buildInfoGetGitHash(1);
    const char* githash2 = buildInfoGetGitHash(2);
    const char* githash3 = buildInfoGetGitHash(3);
    const char* githash4 = buildInfoGetGitHash(4);
    const char* githash5 = buildInfoGetGitHash(5);
    if (strlen(githash1) > 0) {
      jobInfoFile << "PeleLM git hash: " << githash1 << "\n";
    }
    if (strlen(githash2) > 0) {
      jobInfoFile << "AMReX git hash: " << githash2 << "\n";
    }
    if (strlen(githash3) > 0) {
      jobInfoFile << "IAMR   git hash: " << githash3 << "\n";
    }
    if (strlen(githash4) > 0) {
      jobInfoFile << "AMReX-Hydro git hash: " << githash4 << "\n";
    }
    if (strlen(githash4) > 0) {
      jobInfoFile << "PelePhysics git hash: " << githash5 << "\n";
    }

    jobInfoFile << "\n\n";


    // runtime parameters
    jobInfoFile << PrettyLine;
    jobInfoFile << " Inputs File Parameters\n";
    jobInfoFile << PrettyLine;

    ParmParse::dumpTable(jobInfoFile, true);

    jobInfoFile.close();

  }
  // Build the directory to hold the MultiFab at this level.
  // The name is relative to the directory containing the Header file.
  //
  static const std::string BaseName = "/Cell";

  std::string LevelStr = amrex::Concatenate("Level_", level, 1);
  //
  // Now for the full pathname of that directory.
  //
  std::string FullPath = dir;
  if (!FullPath.empty() && FullPath[FullPath.length()-1] != '/')
    FullPath += '/';
  FullPath += LevelStr;
  //
  // Only the I/O processor makes the directory if it doesn't already exist.
  //
  if (ParallelDescriptor::IOProcessor())
    if (!amrex::UtilCreateDirectory(FullPath, 0755))
      amrex::CreateDirectoryFailed(FullPath);
  //
  // Force other processors to wait till directory is built.
  //
  ParallelDescriptor::Barrier();

  if (ParallelDescriptor::IOProcessor())
  {
    os << level << ' ' << grids.size() << ' ' << tnp1 << '\n';
    os << parent->levelSteps(level) << '\n';

    for (long int i = 0; i < grids.size(); ++i)
    {
      RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());
      for (int n = 0; n < AMREX_SPACEDIM; n++)
        os << gridloc.lo(n) << ' ' << gridloc.hi(n) << '\n';
    }
    //
    // The full relative pathname of the MultiFabs at this level.
    // The name is relative to the Header file containing this name.
    // It's the name that gets written into the Header.
    //
    if (n_data_items > 0)
    {
      std::string PathNameInHeader = LevelStr;
      PathNameInHeader += BaseName;
      os << PathNameInHeader << '\n';
    }

#ifdef AMREX_USE_EB
    // volfrac threshhold for amrvis
    // fixme? pulled directly from CNS, might need adjustment
        if (level == parent->finestLevel()) {
            for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
                os << "1.0e-6\n";
            }
        }
#endif


  }
  //
  // We combine all of the multifabs -- state, derived, etc -- into one
  // multifab -- plotMF.
  // NOTE: we are assuming that each state variable has one component,
  // but a derived variable is allowed to have multiple components.
  int       cnt   = 0;
  int       ncomp = 1;
  const int nGrow = 0;
  //MultiFab  plotMF(grids,dmap,n_data_items,nGrow);
  MultiFab plotMF(grids,dmap,n_data_items,nGrow,MFInfo(),Factory());
  MultiFab* this_dat = 0;
  //
  // Cull data from state variables -- use no ghost cells.
  //
  for (long unsigned int i = 0; i < plot_var_map.size(); i++)
  {
    int typ  = plot_var_map[i].first;
    int comp = plot_var_map[i].second;
    this_dat = &state[typ].newData();
    MultiFab::Copy(plotMF,*this_dat,comp,cnt,ncomp,nGrow);
    cnt+= ncomp;
  }
  //
  // Cull data from derived variables.
  //
  Real plot_time;

  if (derive_names.size() > 0)
  {
    for (std::list<std::string>::const_iterator it = derive_names.begin(), end = derive_names.end();
         it != end;
         ++it)
    {
      if (*it == "avg_pressure" ||
          *it == "gradpx"       ||
          *it == "gradpy"       ||
          *it == "gradpz")
      {
        if (state[Press_Type].descriptor()->timeType() ==
            StateDescriptor::Interval)
        {
          plot_time = tnp1;
        }
        else
        {
          int f_lev = parent->finestLevel();
          plot_time = getLevel(f_lev).state[Press_Type].curTime();
        }
      }
      else
      {
        plot_time = tnp1;
      }
      const DeriveRec* rec = derive_lst.get(*it);
      ncomp = rec->numDerive();
      auto derive_dat = derive(*it,plot_time,nGrow);
      MultiFab::Copy(plotMF,*derive_dat,0,cnt,ncomp,nGrow);
      cnt += ncomp;
    }
  }


  //
  // Cull data from diagnostic multifabs.
  //
  for (const auto& kv : auxDiag)
  {
      int nComp = kv.second->nComp();
      MultiFab::Copy(plotMF,*kv.second,0,cnt,nComp,nGrow);
      cnt += nComp;
  }

#ifdef AMREX_USE_EB
    // add volume fraction to plotfile
    plotMF.setVal(0.0, cnt, 1, nGrow);
    MultiFab::Copy(plotMF,*volfrac,0,cnt,1,nGrow);

    // set covered values for ease of viewing
    EB_set_covered(plotMF, 0.0);
#endif

  //
  // Use the Full pathname when naming the MultiFab.
  //
  std::string TheFullPath = FullPath;
  TheFullPath += BaseName;

//#ifdef AMREX_USE_EB
//  bool plot_centroid_data = true;
//  pp.query("plot_centroid_data",plot_centroid_data);
//  if (plot_centroid_data) {
//    MultiFab TT(grids,dmap,plotMF.nComp(),plotMF.nGrow()+1,MFInfo(),Factory());
//    MultiFab::Copy(TT,plotMF,0,0,plotMF.nComp(),plotMF.nGrow());
//    TT.FillBoundary(geom.periodicity());
//    EB_interp_CC_to_Centroid(plotMF,TT,0,0,plotMF.nComp(),geom);
//  }
//#endif

  VisMF::Write(plotMF,TheFullPath,how);
}